

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

void phys_page_set(AddressSpaceDispatch *d,hwaddr index,uint64_t nb,uint16_t leaf)

{
  uint64_t uStack_20;
  uint16_t leaf_local;
  uint64_t nb_local;
  hwaddr index_local;
  AddressSpaceDispatch *d_local;
  
  uStack_20 = nb;
  nb_local = index;
  index_local = (hwaddr)d;
  phys_map_node_reserve(d,&d->map,0x12);
  phys_page_set_level((PhysPageMap *)(index_local + 0x10),(PhysPageEntry *)(index_local + 8),
                      &nb_local,&stack0xffffffffffffffe0,leaf,5);
  return;
}

Assistant:

static void phys_page_set(AddressSpaceDispatch *d,
                          hwaddr index, uint64_t nb,
                          uint16_t leaf)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = d->uc;
#endif
    /* Wildly overreserve - it doesn't matter much. */
    phys_map_node_reserve(d, &d->map, 3 * P_L2_LEVELS);

    phys_page_set_level(&d->map, &d->phys_map, &index, &nb, leaf, P_L2_LEVELS - 1);
}